

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O1

int __thiscall HttpResponse::parseFirstLine(HttpResponse *this,CircularBuffer *buf)

{
  bool bVar1;
  _Alloc_hider __nptr;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint i;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  char cVar10;
  ulong uVar11;
  char *endptr;
  string statusCodeStr;
  
  statusCodeStr._M_dataplus._M_p = (pointer)&statusCodeStr.field_2;
  statusCodeStr._M_string_length = 0;
  statusCodeStr.field_2._M_local_buf[0] = '\0';
  iVar2 = JetHead::CircularBuffer::getLength(buf);
  if (1 < iVar2) {
    iVar2 = JetHead::CircularBuffer::byteAt(buf,0);
    if (iVar2 == 0xd) {
      iVar4 = JetHead::CircularBuffer::byteAt(buf,1);
      iVar2 = 2;
      if (iVar4 == 10) goto LAB_00119f35;
    }
    uVar3 = 0;
    uVar11 = 0;
    do {
      do {
        i = uVar3;
        iVar2 = JetHead::CircularBuffer::getLength(buf);
        if ((iVar2 <= (int)i) || ((int)uVar11 == 5)) {
          uVar3 = JetHead::CircularBuffer::getLength(buf);
          jh_log_print(0,"virtual int HttpResponse::parseFirstLine(const CircularBuffer &)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                       ,0xf4,"problem at %d parsing buffer of length %d, state %d",(ulong)i,
                       (ulong)uVar3,uVar11);
          iVar2 = -1;
          goto LAB_00119f35;
        }
        uVar5 = JetHead::CircularBuffer::byteAt(buf,i);
        __nptr = statusCodeStr._M_dataplus;
        cVar10 = (char)uVar5;
        switch((int)uVar11) {
        case 1:
          goto switchD_00119e04_caseD_1;
        case 2:
          goto switchD_00119e04_caseD_2;
        case 3:
          goto switchD_00119e04_caseD_3;
        case 4:
          goto switchD_00119e04_caseD_4;
        }
        uVar3 = i + 1;
      } while (cVar10 != ' ');
      uVar11 = 1;
switchD_00119e04_caseD_1:
      uVar6 = (uint)uVar11;
      uVar11 = 2;
      if (cVar10 != ' ') {
switchD_00119e04_caseD_2:
        uVar6 = (uint)uVar11;
        if (cVar10 == ' ') {
          endptr = (char *)0x0;
          piVar8 = __errno_location();
          *piVar8 = 0;
          lVar9 = strtol(__nptr._M_p,&endptr,10);
          this->mResponseCode = (int)lVar9;
          if ((__nptr._M_p == endptr) || (*piVar8 != 0)) {
            uVar6 = 5;
            bVar1 = false;
            jh_log_print(1,"virtual int HttpResponse::parseFirstLine(const CircularBuffer &)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                         ,0xbd,"problem converting %s to int",__nptr._M_p);
          }
          else {
            bVar1 = true;
          }
          uVar11 = 3;
          if (bVar1) {
switchD_00119e04_caseD_3:
            uVar6 = (uint)uVar11;
            uVar11 = 4;
            if (cVar10 != ' ') {
switchD_00119e04_caseD_4:
              if ((cVar10 == '\r') || (uVar6 = (uint)uVar11, (uVar5 & 0xff) == 10))
              goto LAB_00119f63;
            }
          }
        }
        else {
          std::__cxx11::string::push_back((char)&statusCodeStr);
        }
      }
      uVar3 = i + 1;
      uVar11 = (ulong)uVar6;
    } while( true );
  }
  uVar3 = JetHead::CircularBuffer::getLength(buf);
  jh_log_print(0,"virtual int HttpResponse::parseFirstLine(const CircularBuffer &)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
               ,0x86,"called with only %d bytes in buffer",(ulong)uVar3);
  iVar2 = -1;
  goto LAB_00119f35;
LAB_00119f63:
  iVar2 = JetHead::CircularBuffer::getLength(buf);
  iVar4 = i + 1;
  if (iVar4 < iVar2) {
    iVar2 = JetHead::CircularBuffer::byteAt(buf,iVar4);
    if (iVar2 == 10) {
      iVar4 = i + 2;
    }
  }
  iVar2 = iVar4;
  if (this->mResponseCode == 100) {
    iVar7 = JetHead::CircularBuffer::getLength(buf);
    if ((iVar4 + 1 < iVar7) && (iVar7 = JetHead::CircularBuffer::byteAt(buf,iVar4), iVar7 == 0xd)) {
      iVar7 = JetHead::CircularBuffer::byteAt(buf,iVar4 + 1);
      iVar2 = iVar4 + 2;
      if (iVar7 != 10) {
        iVar2 = iVar4;
      }
    }
  }
LAB_00119f35:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)statusCodeStr._M_dataplus._M_p != &statusCodeStr.field_2) {
    operator_delete(statusCodeStr._M_dataplus._M_p,
                    CONCAT71(statusCodeStr.field_2._M_allocated_capacity._1_7_,
                             statusCodeStr.field_2._M_local_buf[0]) + 1);
  }
  return iVar2;
}

Assistant:

int HttpResponse::parseFirstLine( const CircularBuffer &buf )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	int i = 0;
	char c = 0;

	std::string statusCodeStr;

	enum { ParseProtocol,
		   SeekStatusCode,
		   ParseStatusCode,
		   SeekStatusText,
		   ParseStatusText,
		   ParsingError } state = ParseProtocol;

	// We should only be called on buffers that contain at least two
	// bytes of CRLF
	if (buf.getLength() <= 1)
	{
		LOG_ERR("called with only %d bytes in buffer", buf.getLength());
		return -1;
	}
	
	// In the case of having got a 100, we might now get a blank line
	// before the real header.
	if (buf.byteAt(0) == '\r' and buf.byteAt(1) == '\n')
	{
		return 2;
	}
	
	while(i < buf.getLength() and state != ParsingError)
	{
		c = buf.byteAt(i++);
		
		switch(state)
		{
		case ParseProtocol:
			if (c != ' ')
			{
				// append c to protocol string, unimplemented for now
				break;
			}
			state = SeekStatusCode;
			// found a space, so fall through to the next state to
			// handle the space
			
		case SeekStatusCode:
			if (c == ' ')
			{
				// skip over spaces to get to status code
				break;
			}
			state = ParseStatusCode;
			// found a non-space, so fall through to the next state to
			// handle the non-space char
			
		case ParseStatusCode:
			if (c != ' ')
			{
				// append c to status code string
				statusCodeStr += c;
				break;
			}
			// found a space, convert statusCodeStr to int
			else
			{
				const char* nptr = statusCodeStr.c_str();
				char* endptr = NULL;
				errno = 0;
				
				mResponseCode = strtol(nptr, &endptr, 10);

				if (nptr == endptr or errno != 0)
				{
					LOG_ERR_PERROR("problem converting %s to int", nptr);
					state = ParsingError;
					break;
				}
			}

			state = SeekStatusText;
			// found a space, so fall through to the next state to
			// handle the space

		case SeekStatusText:
			if (c == ' ')
			{
				// skip over spaces to get to status text
				break;
			}
			state = ParseStatusText;
			// found a non-space, so fall through to the next state to
			// handle the non-space char

		case ParseStatusText:
			if (c != '\r' and c != '\n')
			{
				// append c to status text string, unimplemented for now
				break;
			}

			// if CRLF move past LF
			if (i < buf.getLength() and buf.byteAt(i) == '\n')
			{
				++i;
			}

			// If we got a 100 and there is enough data in the buffer
			// for the (possible) additional \r\n, then consume those
			// now too.
			if ( mResponseCode == 100 and i + 1 < buf.getLength() and
				 buf.byteAt(i) == '\r' and buf.byteAt(i + 1) == '\n' )
			{
				i += 2;
			}

			// Parsing complete, return the number of bytes to be
			// removed from the buffer
			return i;

		default:
			LOG_ERR_FATAL("invalid state %d", state);
			state = ParsingError;
		}
	}

	// If we exited the parsing loop, then encountered an error while
	// parsing or ran out of data, so return an error
	LOG_ERR("problem at %d parsing buffer of length %d, state %d",
			i, buf.getLength(), state);

	return -1;
}